

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stackFrame.c
# Opt level: O2

void sysbvm_stackFrame_raiseException(sysbvm_tuple_t exception)

{
  sysbvm_context_t *context;
  _Bool _Var1;
  sysbvm_stackFrameRecord_s *psVar2;
  sysbvm_tuple_t sVar3;
  long *plVar4;
  ulong uVar5;
  sysbvm_stackFrameLandingPadRecord_t *landingPadRecord;
  sysbvm_stackFrameRecord_t *targetRecord;
  long *in_FS_OFFSET;
  sysbvm_tuple_t local_20;
  
  plVar4 = (long *)(*in_FS_OFFSET + -0x10);
  if ((long *)in_FS_OFFSET[-1] != (long *)0x0) {
    plVar4 = (long *)in_FS_OFFSET[-1];
  }
  targetRecord = (sysbvm_stackFrameRecord_t *)*plVar4;
  if (targetRecord == (sysbvm_stackFrameRecord_t *)0x0) {
    fwrite("Cannot raise an exception without an active context.\n",0x35,1,_stderr);
    abort();
  }
  context = (sysbvm_context_t *)in_FS_OFFSET[-3];
  do {
    if (targetRecord == (sysbvm_stackFrameRecord_t *)0x0) {
      sVar3 = sysbvm_tuple_asString(context,exception);
      uVar5 = 0;
      if ((sVar3 & 0xf) == 0 && sVar3 != 0) {
        uVar5 = (ulong)*(uint *)(sVar3 + 0xc);
      }
      fprintf(_stderr,"Unhandled exception: %.*s\n",uVar5,sVar3 + 0x10);
      sVar3 = sysbvm_stackFrame_buildStackTraceUpTo((sysbvm_stackFrameRecord_t *)0x0);
      sysbvm_stackFrame_printStackTrace(context,sVar3);
      abort();
    }
    if (targetRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD) {
      if (targetRecord[1].previous == (sysbvm_stackFrameRecord_s *)0x0) {
LAB_0013c054:
        in_FS_OFFSET[-1] = (long)targetRecord;
        targetRecord[2].previous = (sysbvm_stackFrameRecord_s *)exception;
        if (*(sysbvm_tuple_t *)&targetRecord[2].type != 0) {
          local_20 = exception;
          psVar2 = (sysbvm_stackFrameRecord_s *)
                   sysbvm_function_apply
                             (context,*(sysbvm_tuple_t *)&targetRecord[2].type,1,&local_20,0);
          targetRecord[3].previous = psVar2;
        }
        if (targetRecord->field_0xc == '\x01') {
          sVar3 = sysbvm_stackFrame_buildStackTraceUpTo(targetRecord);
          *(sysbvm_tuple_t *)&targetRecord[1].type = sVar3;
        }
        in_FS_OFFSET[-1] = 0;
        sysbvm_stackFrame_prepareUnwindingUntil(targetRecord);
        in_FS_OFFSET[-2] = (long)targetRecord;
        longjmp((__jmp_buf_tag *)&targetRecord[3].type,1);
      }
      _Var1 = sysbvm_tuple_isKindOf(context,exception,(sysbvm_tuple_t)targetRecord[1].previous);
      if (_Var1) goto LAB_0013c054;
    }
    targetRecord = targetRecord->previous;
  } while( true );
}

Assistant:

SYSBVM_API void sysbvm_stackFrame_raiseException(sysbvm_tuple_t exception)
{
    sysbvm_context_t *context = sysbvm_stackFrame_activeContext;
    sysbvm_stackFrameRecord_t *exceptionRecord = sysbvm_stackFrame_activeHandlerRecord ? sysbvm_stackFrame_activeHandlerRecord->previous : sysbvm_stackFrame_activeRecord;

    if(!exceptionRecord)
    {
        fprintf(stderr, "Cannot raise an exception without an active context.\n");
        abort();
    }


    // Find the landing pad record.
    sysbvm_stackFrameRecord_t *stackFrameRecord = exceptionRecord;
    while(stackFrameRecord)
    {
        if(stackFrameRecord->type == SYSBVM_STACK_FRAME_RECORD_TYPE_LANDING_PAD)
        {
            sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)stackFrameRecord;
            if(!landingPadRecord->exceptionFilter || sysbvm_tuple_isKindOf(context, exception, landingPadRecord->exceptionFilter))
                break;
        }
        stackFrameRecord = stackFrameRecord->previous;
    }

    // Did we find it?
    if(!stackFrameRecord)
    {
        sysbvm_tuple_t errorString = sysbvm_tuple_asString(context, exception);
        fprintf(stderr, "Unhandled exception: " SYSBVM_STRING_PRINTF_FORMAT "\n", SYSBVM_STRING_PRINTF_ARG(errorString));
        sysbvm_stackFrame_printStackTrace(context, sysbvm_stackFrame_buildStackTraceUpTo(NULL));
        abort();
    }

    // We found it, transfer the control flow onto it.
    sysbvm_stackFrame_activeHandlerRecord = stackFrameRecord;
    sysbvm_stackFrameLandingPadRecord_t *landingPadRecord = (sysbvm_stackFrameLandingPadRecord_t*)stackFrameRecord;
    landingPadRecord->exception = exception;

    // Do we have an action on it?
    if(landingPadRecord->action)
    {
        // Invoke the action.
        landingPadRecord->actionResult = sysbvm_function_apply1(context, landingPadRecord->action, landingPadRecord->exception);
        exception = landingPadRecord->exception;
    }

    if(landingPadRecord->keepStackTrace)
        landingPadRecord->stackTrace = sysbvm_stackFrame_buildStackTraceUpTo((sysbvm_stackFrameRecord_t*)landingPadRecord);

    sysbvm_stackFrame_activeHandlerRecord = NULL;
    sysbvm_stackFrame_prepareUnwindingUntil((sysbvm_stackFrameRecord_t*)landingPadRecord);
    sysbvm_stackFrame_activeRecord = (sysbvm_stackFrameRecord_t*)landingPadRecord;
    longjmp(landingPadRecord->jmpbuffer, 1);
}